

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_wnaf_fixed(int *wnaf,secp256k1_scalar *s,int w)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  int in_EDX;
  secp256k1_scalar *in_RSI;
  int *in_RDI;
  int val_1;
  int val;
  secp256k1_scalar *work;
  int last_w;
  int max_pos;
  int pos;
  int skew;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar4;
  int local_24;
  uint local_20;
  uint local_4;
  
  iVar1 = secp256k1_scalar_is_zero(in_RSI);
  if (iVar1 == 0) {
    iVar1 = secp256k1_scalar_is_even(in_RSI);
    local_20 = (uint)(iVar1 != 0);
    uVar2 = secp256k1_scalar_get_bits_var
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0,0x143020);
    *in_RDI = uVar2 + local_20;
    local_24 = (in_EDX + 0x7f) / in_EDX;
    while ((local_24 = local_24 + -1, iVar1 = local_24, 0 < local_24 &&
           (uVar2 = secp256k1_scalar_get_bits_var
                              ((secp256k1_scalar *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0,
                               0x1430d7), uVar2 == 0))) {
      in_RDI[local_24] = 0;
    }
    for (local_24 = 1; local_24 <= iVar1; local_24 = local_24 + 1) {
      iVar4 = in_EDX;
      if (local_24 == (in_EDX + 0x7f) / in_EDX + -1) {
        iVar4 = 0x80 - ((in_EDX + 0x7f) / in_EDX + -1) * in_EDX;
      }
      uVar2 = secp256k1_scalar_get_bits_var
                        ((secp256k1_scalar *)CONCAT44(iVar4,in_stack_ffffffffffffff88),0,0x143184);
      bVar3 = (byte)in_EDX;
      if ((uVar2 & 1) == 0) {
        in_RDI[local_24 + -1] = in_RDI[local_24 + -1] - (1 << (bVar3 & 0x1f));
        in_RDI[local_24] = uVar2 + 1;
      }
      else {
        in_RDI[local_24] = uVar2;
      }
      if ((1 < local_24) &&
         (((in_RDI[local_24 + -1] == 1 && (in_RDI[local_24 + -2] < 0)) ||
          ((in_RDI[local_24 + -1] == -1 && (0 < in_RDI[local_24 + -2])))))) {
        if (in_RDI[local_24 + -1] == 1) {
          in_RDI[local_24 + -2] = (1 << (bVar3 & 0x1f)) + in_RDI[local_24 + -2];
        }
        else {
          in_RDI[local_24 + -2] = in_RDI[local_24 + -2] - (1 << (bVar3 & 0x1f));
        }
        in_RDI[local_24 + -1] = 0;
      }
    }
    local_4 = local_20;
  }
  else {
    for (local_24 = 0; local_24 < (in_EDX + 0x7f) / in_EDX; local_24 = local_24 + 1) {
      in_RDI[local_24] = 0;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_wnaf_fixed(int *wnaf, const secp256k1_scalar *s, int w) {
    int skew = 0;
    int pos;
    int max_pos;
    int last_w;
    const secp256k1_scalar *work = s;

    if (secp256k1_scalar_is_zero(s)) {
        for (pos = 0; pos < WNAF_SIZE(w); pos++) {
            wnaf[pos] = 0;
        }
        return 0;
    }

    if (secp256k1_scalar_is_even(s)) {
        skew = 1;
    }

    wnaf[0] = secp256k1_scalar_get_bits_var(work, 0, w) + skew;
    /* Compute last window size. Relevant when window size doesn't divide the
     * number of bits in the scalar */
    last_w = WNAF_BITS - (WNAF_SIZE(w) - 1) * w;

    /* Store the position of the first nonzero word in max_pos to allow
     * skipping leading zeros when calculating the wnaf. */
    for (pos = WNAF_SIZE(w) - 1; pos > 0; pos--) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if(val != 0) {
            break;
        }
        wnaf[pos] = 0;
    }
    max_pos = pos;
    pos = 1;

    while (pos <= max_pos) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if ((val & 1) == 0) {
            wnaf[pos - 1] -= (1 << w);
            wnaf[pos] = (val + 1);
        } else {
            wnaf[pos] = val;
        }
        /* Set a coefficient to zero if it is 1 or -1 and the proceeding digit
         * is strictly negative or strictly positive respectively. Only change
         * coefficients at previous positions because above code assumes that
         * wnaf[pos - 1] is odd.
         */
        if (pos >= 2 && ((wnaf[pos - 1] == 1 && wnaf[pos - 2] < 0) || (wnaf[pos - 1] == -1 && wnaf[pos - 2] > 0))) {
            if (wnaf[pos - 1] == 1) {
                wnaf[pos - 2] += 1 << w;
            } else {
                wnaf[pos - 2] -= 1 << w;
            }
            wnaf[pos - 1] = 0;
        }
        ++pos;
    }

    return skew;
}